

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mpir.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  string *this;
  char *__s;
  long lVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  int num_output_order;
  int num_input_order;
  vector<double,_std::allocator<double>_> minimum_phase_impulse_response;
  vector<double,_std::allocator<double>_> cepstrum;
  ostringstream error_message_5;
  CepstrumToMinimumPhaseImpulseResponse cepstrum_to_minimum_phase_impulse_response;
  ifstream ifs;
  int local_420;
  int local_41c;
  string local_418;
  vector<double,_std::allocator<double>_> local_3f8;
  vector<double,_std::allocator<double>_> local_3e0;
  string local_3c8 [3];
  ios_base local_358 [264];
  CepstrumToMinimumPhaseImpulseResponse local_250;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_41c = 0x19;
  local_420 = 0xff;
  iVar7 = 0;
  do {
    iVar3 = ya_getopt_long(argc,argv,"m:M:l:h",(option *)0x0,(int *)0x0);
    if (iVar3 < 0x68) {
      iVar5 = 2;
      if (iVar3 != -1) {
        if (iVar3 == 0x4d) {
          std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3c8);
          bVar1 = sptk::ConvertStringToInteger(&local_238,&local_420);
          bVar9 = -1 < local_420;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p);
          }
          if (bVar1 && bVar9) goto LAB_00103933;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,"The argument for the -M option must be a ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,"non-negative integer",0x14);
          local_3c8[0]._M_dataplus._M_p = (pointer)&local_3c8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"c2mpir","");
          sptk::PrintErrorMessage(local_3c8,(ostringstream *)&local_238);
          goto LAB_001039a2;
        }
LAB_0010393a:
        anon_unknown.dwarf_2baf::PrintUsage((ostream *)&std::cerr);
        iVar5 = 1;
        iVar7 = 1;
      }
    }
    else if (iVar3 == 0x68) {
      anon_unknown.dwarf_2baf::PrintUsage((ostream *)&std::cout);
      iVar7 = 0;
      iVar5 = 1;
    }
    else {
      if (iVar3 == 0x6c) {
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3c8);
        bVar9 = sptk::ConvertStringToInteger(&local_238,&local_420);
        bVar1 = 0 < local_420;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar9 && bVar1) {
          local_420 = local_420 + -1;
LAB_00103933:
          iVar5 = 0;
          goto LAB_001039df;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_3c8[0]._M_dataplus._M_p = (pointer)&local_3c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"c2mpir","");
        sptk::PrintErrorMessage(local_3c8,(ostringstream *)&local_238);
      }
      else {
        if (iVar3 != 0x6d) goto LAB_0010393a;
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3c8);
        bVar1 = sptk::ConvertStringToInteger(&local_238,&local_41c);
        bVar9 = -1 < local_41c;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar1 && bVar9) goto LAB_00103933;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3c8[0]._M_dataplus._M_p = (pointer)&local_3c8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"c2mpir","");
        sptk::PrintErrorMessage(local_3c8,(ostringstream *)&local_238);
      }
LAB_001039a2:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8[0]._M_dataplus._M_p != &local_3c8[0].field_2) {
        operator_delete(local_3c8[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      iVar5 = 1;
      iVar7 = 1;
    }
LAB_001039df:
  } while (iVar5 == 0);
  if (iVar5 != 2) {
    return iVar7;
  }
  if (argc - ya_optind < 2) {
    if (argc == ya_optind) {
      __s = (char *)0x0;
    }
    else {
      __s = argv[ya_optind];
    }
    bVar1 = sptk::SetBinaryMode();
    this = &local_238;
    if (bVar1) {
      std::ifstream::ifstream(this);
      if ((__s == (char *)0x0) ||
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          this = (string *)&std::cin;
        }
        sptk::CepstrumToMinimumPhaseImpulseResponse::CepstrumToMinimumPhaseImpulseResponse
                  (&local_250,local_41c,local_420);
        if (local_250.is_valid_ != false) {
          lVar6 = (long)local_41c;
          lVar8 = (long)local_420;
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_3e0,lVar6 + 1U,(allocator_type *)local_3c8);
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_3f8,lVar8 + 1U,(allocator_type *)local_3c8);
          do {
            bVar1 = sptk::ReadStream<double>
                              (false,0,0,(int)(lVar6 + 1U),&local_3e0,(istream *)this,(int *)0x0);
            if (!bVar1) {
              iVar7 = 0;
              goto LAB_00103e03;
            }
            bVar1 = sptk::CepstrumToMinimumPhaseImpulseResponse::Run
                              (&local_250,&local_3e0,&local_3f8);
            if (!bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3c8,
                         "Failed to convert cepstrum to minimum phase impulse response",0x3c);
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"c2mpir","");
              sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3c8);
              goto LAB_00103dd0;
            }
            bVar1 = sptk::WriteStream<double>
                              (0,(int)(lVar8 + 1U),&local_3f8,(ostream *)&std::cout,(int *)0x0);
          } while (bVar1);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3c8,"Failed to write minimum phase impulse response",0x2e);
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"c2mpir","");
          sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3c8);
LAB_00103dd0:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
          std::ios_base::~ios_base(local_358);
          iVar7 = 1;
LAB_00103e03:
          if (local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          goto LAB_00103e21;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3c8,"Failed to initialize CepstrumToMinimumPhaseImpulseResponse"
                   ,0x3a);
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"c2mpir","");
        sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3c8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3c8,"Cannot open file ",0x11);
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,__s,sVar4);
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"c2mpir","");
        sptk::PrintErrorMessage(&local_418,(ostringstream *)local_3c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
      std::ios_base::~ios_base(local_358);
      iVar7 = 1;
LAB_00103e21:
      std::ifstream::~ifstream(&local_238);
      return iVar7;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Cannot set translation mode",0x1b);
    local_3c8[0]._M_dataplus._M_p = (pointer)&local_3c8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"c2mpir","");
    sptk::PrintErrorMessage(local_3c8,(ostringstream *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8[0]._M_dataplus._M_p == &local_3c8[0].field_2) goto LAB_00103a6c;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_3c8[0]._M_dataplus._M_p = (pointer)&local_3c8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"c2mpir","");
    sptk::PrintErrorMessage(local_3c8,(ostringstream *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8[0]._M_dataplus._M_p == &local_3c8[0].field_2) goto LAB_00103a6c;
  }
  operator_delete(local_3c8[0]._M_dataplus._M_p);
LAB_00103a6c:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
  std::ios_base::~ios_base(local_1c8);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_input_order(kDefaultNumInputOrder);
  int num_output_order(kDefaultNumOutputOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:M:l:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("c2mpir", error_message);
          return 1;
        }
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &num_output_order) ||
            num_output_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("c2mpir", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_output_order) ||
            num_output_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("c2mpir", error_message);
          return 1;
        }
        --num_output_order;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("c2mpir", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("c2mpir", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("c2mpir", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::CepstrumToMinimumPhaseImpulseResponse
      cepstrum_to_minimum_phase_impulse_response(num_input_order,
                                                 num_output_order);
  if (!cepstrum_to_minimum_phase_impulse_response.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize CepstrumToMinimumPhaseImpulseResponse";
    sptk::PrintErrorMessage("c2mpir", error_message);
    return 1;
  }

  const int input_length(num_input_order + 1);
  const int output_length(num_output_order + 1);
  std::vector<double> cepstrum(input_length);
  std::vector<double> minimum_phase_impulse_response(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length, &cepstrum, &input_stream,
                          NULL)) {
    if (!cepstrum_to_minimum_phase_impulse_response.Run(
            cepstrum, &minimum_phase_impulse_response)) {
      std::ostringstream error_message;
      error_message
          << "Failed to convert cepstrum to minimum phase impulse response";
      sptk::PrintErrorMessage("c2mpir", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, minimum_phase_impulse_response,
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write minimum phase impulse response";
      sptk::PrintErrorMessage("c2mpir", error_message);
      return 1;
    }
  }

  return 0;
}